

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int bid_entry(char *p,ssize_t len,ssize_t nl,int *last_is_path)

{
  byte *pbVar1;
  char *p_00;
  undefined4 *in_RCX;
  long in_RDX;
  char *in_RSI;
  byte *in_RDI;
  bool bVar2;
  bool bVar3;
  int slash;
  int name_len;
  char *pb;
  char *pp;
  ssize_t ll;
  int f;
  int local_4c;
  byte *in_stack_ffffffffffffffb8;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  *in_RCX = 0;
  pbVar1 = in_RDI;
  p_00 = in_RSI;
  while( true ) {
    bVar2 = false;
    if ((((0 < (long)p_00) && (bVar2 = false, *pbVar1 != 0x20)) && (bVar2 = false, *pbVar1 != 9)) &&
       (bVar2 = false, *pbVar1 != 0xd)) {
      bVar2 = *pbVar1 != 10;
    }
    if (!bVar2) goto LAB_00147e0f;
    if (""[*pbVar1] == '\0') break;
    pbVar1 = pbVar1 + 1;
    p_00 = p_00 + -1;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
LAB_00147e0f:
  if (local_2c == 0) {
    pbVar1 = in_RDI + (long)in_RSI + -in_RDX;
    local_4c = 0;
    if (((pbVar1 + -2 < in_RDI) || (pbVar1[-1] != 0x5c)) ||
       ((pbVar1[-2] != 0x20 && (pbVar1[-2] != 9)))) {
      if ((pbVar1 + -1 < in_RDI) || (pbVar1[-1] != 0x5c)) {
        bVar2 = false;
        while( true ) {
          in_stack_ffffffffffffffb8 = pbVar1 + -1;
          bVar3 = false;
          if ((in_RDI <= in_stack_ffffffffffffffb8) &&
             (bVar3 = false, *in_stack_ffffffffffffffb8 != 0x20)) {
            bVar3 = *in_stack_ffffffffffffffb8 != 9;
          }
          if (!bVar3) {
            if ((local_4c == 0) || (!bVar2)) {
              return -1;
            }
            if (*pbVar1 == 0x2f) {
              return -1;
            }
            p_00 = in_RSI + (-(long)local_4c - in_RDX);
            *in_RCX = 1;
            pbVar1 = in_RDI;
            goto LAB_00147fa7;
          }
          if (""[*in_stack_ffffffffffffffb8] == '\0') break;
          local_4c = local_4c + 1;
          pbVar1 = in_stack_ffffffffffffffb8;
          if (*in_stack_ffffffffffffffb8 == 0x2f) {
            bVar2 = true;
          }
        }
        local_4 = -1;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
LAB_00147fa7:
    local_4 = bid_keyword_list(p_00,(ssize_t)pbVar1,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                               (int)in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

static int
bid_entry(const char *p, ssize_t len, ssize_t nl, int *last_is_path)
{
	int f = 0;
	static const unsigned char safe_char[256] = {
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* 00 - 0F */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* 10 - 1F */
		/* !"$%&'()*+,-./  EXCLUSION:( )(#) */
		0, 1, 1, 0, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, /* 20 - 2F */
		/* 0123456789:;<>?  EXCLUSION:(=) */
		1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 1, 1, /* 30 - 3F */
		/* @ABCDEFGHIJKLMNO */
		1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, /* 40 - 4F */
		/* PQRSTUVWXYZ[\]^_  */
		1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, /* 50 - 5F */
		/* `abcdefghijklmno */
		1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, /* 60 - 6F */
		/* pqrstuvwxyz{|}~ */
		1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, /* 70 - 7F */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* 80 - 8F */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* 90 - 9F */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* A0 - AF */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* B0 - BF */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* C0 - CF */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* D0 - DF */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* E0 - EF */
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, /* F0 - FF */
	};
	ssize_t ll = len;
	const char *pp = p;

	*last_is_path = 0;
	/*
	 * Skip the path-name which is quoted.
	 */
	while (ll > 0 && *pp != ' ' &&*pp != '\t' && *pp != '\r' &&
	    *pp != '\n') {
		if (!safe_char[*(const unsigned char *)pp]) {
			f = 0;
			break;
		}
		++pp;
		--ll;
		++f;
	}
	/* If a path-name was not found at the first, try to check
	 * a mtree format ``NetBSD's mtree -D'' creates, which
	 * places the path-name at the last. */
	if (f == 0) {
		const char *pb = p + len - nl;
		int name_len = 0;
		int slash;

		/* Do not accept multi lines for form D. */
		if (pb-2 >= p &&
		    pb[-1] == '\\' && (pb[-2] == ' ' || pb[-2] == '\t'))
			return (-1);
		if (pb-1 >= p && pb[-1] == '\\')
			return (-1);

		slash = 0;
		while (p <= --pb && *pb != ' ' && *pb != '\t') {
			if (!safe_char[*(const unsigned char *)pb])
				return (-1);
			name_len++;
			/* The pathname should have a slash in this
			 * format. */
			if (*pb == '/')
				slash = 1;
		}
		if (name_len == 0 || slash == 0)
			return (-1);
		/* If '/' is placed at the first in this field, this is not
		 * a valid filename. */
		if (pb[1] == '/')
			return (-1);
		ll = len - nl - name_len;
		pp = p;
		*last_is_path = 1;
	}

	return (bid_keyword_list(pp, ll, 0, *last_is_path));
}